

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::Proxy_Function_Callable_Impl<bool_(),_bool_(*)()_noexcept>::
Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<bool_(),_bool_(*)()_noexcept> *this,_func_bool *f)

{
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_30;
  _func_bool *local_18;
  _func_bool *f_local;
  Proxy_Function_Callable_Impl<bool_(),_bool_(*)()_noexcept> *this_local;
  
  local_18 = f;
  f_local = (_func_bool *)this;
  detail::build_param_type_list<bool>(&local_30,(_func_bool *)0x0);
  Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            (&this->super_Proxy_Function_Impl_Base,&local_30);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector(&local_30);
  (this->super_Proxy_Function_Impl_Base).super_Proxy_Function_Base._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Proxy_Function_Callable_Impl_00825e20;
  this->m_f = local_18;
  return;
}

Assistant:

explicit Proxy_Function_Callable_Impl(Callable f)
          : Proxy_Function_Impl_Base(detail::build_param_type_list(static_cast<Func *>(nullptr)))
          , m_f(std::move(f)) {
      }